

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_hash_map.hpp
# Opt level: O2

void __thiscall
ska::detailv3::
sherwood_v3_table<std::pair<slang::ast::GenericClassDefSymbol::SpecializationKey,_const_slang::ast::Type_*>,_slang::ast::GenericClassDefSymbol::SpecializationKey,_slang::ast::GenericClassDefSymbol::Hasher,_ska::detailv3::KeyOrValueHasher<slang::ast::GenericClassDefSymbol::SpecializationKey,_std::pair<slang::ast::GenericClassDefSymbol::SpecializationKey,_const_slang::ast::Type_*>,_slang::ast::GenericClassDefSymbol::Hasher>,_std::equal_to<slang::ast::GenericClassDefSymbol::SpecializationKey>,_ska::detailv3::KeyOrValueEquality<slang::ast::GenericClassDefSymbol::SpecializationKey,_std::pair<slang::ast::GenericClassDefSymbol::SpecializationKey,_const_slang::ast::Type_*>,_std::equal_to<slang::ast::GenericClassDefSymbol::SpecializationKey>_>,_std::allocator<std::pair<slang::ast::GenericClassDefSymbol::SpecializationKey,_const_slang::ast::Type_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ast::GenericClassDefSymbol::SpecializationKey,_const_slang::ast::Type_*>_>_>_>
::rehash(sherwood_v3_table<std::pair<slang::ast::GenericClassDefSymbol::SpecializationKey,_const_slang::ast::Type_*>,_slang::ast::GenericClassDefSymbol::SpecializationKey,_slang::ast::GenericClassDefSymbol::Hasher,_ska::detailv3::KeyOrValueHasher<slang::ast::GenericClassDefSymbol::SpecializationKey,_std::pair<slang::ast::GenericClassDefSymbol::SpecializationKey,_const_slang::ast::Type_*>,_slang::ast::GenericClassDefSymbol::Hasher>,_std::equal_to<slang::ast::GenericClassDefSymbol::SpecializationKey>,_ska::detailv3::KeyOrValueEquality<slang::ast::GenericClassDefSymbol::SpecializationKey,_std::pair<slang::ast::GenericClassDefSymbol::SpecializationKey,_const_slang::ast::Type_*>,_std::equal_to<slang::ast::GenericClassDefSymbol::SpecializationKey>_>,_std::allocator<std::pair<slang::ast::GenericClassDefSymbol::SpecializationKey,_const_slang::ast::Type_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ast::GenericClassDefSymbol::SpecializationKey,_const_slang::ast::Type_*>_>_>_>
         *this,size_t num_buckets)

{
  char max_lookups;
  EntryPointer begin;
  EntryPointer psVar1;
  int8_t iVar2;
  int8_t iVar3;
  size_t sVar4;
  pointer psVar5;
  long lVar6;
  long lVar7;
  anon_union_56_1_a8c68091_for_sherwood_v3_entry<std::pair<slang::ast::GenericClassDefSymbol::SpecializationKey,_const_slang::ast::Type_*>_>_3
  *key;
  double dVar8;
  size_t local_38;
  
  dVar8 = ceil((((double)CONCAT44(0x45300000,(int)(this->num_elements >> 0x20)) -
                1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)this->num_elements) - 4503599627370496.0)) /
               (double)this->_max_load_factor);
  local_38 = (long)(dVar8 - 9.223372036854776e+18) & (long)dVar8 >> 0x3f | (long)dVar8;
  if (local_38 <= num_buckets) {
    local_38 = num_buckets;
  }
  if (local_38 != 0) {
    iVar2 = fibonacci_hash_policy::next_size_over(&this->hash_policy,&local_38);
    sVar4 = this->num_slots_minus_one;
    if (sVar4 != 0) {
      sVar4 = sVar4 + 1;
    }
    if (local_38 != sVar4) {
      iVar3 = compute_max_lookups(local_38);
      lVar7 = (long)iVar3;
      psVar5 = std::
               allocator_traits<std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ast::GenericClassDefSymbol::SpecializationKey,_const_slang::ast::Type_*>_>_>_>
               ::allocate((allocator_type *)this,local_38 + lVar7);
      for (lVar6 = 0; local_38 * 0x40 + lVar7 * 0x40 + -0x40 != lVar6; lVar6 = lVar6 + 0x40) {
        (&psVar5->distance_from_desired)[lVar6] = -1;
      }
      psVar5[lVar7 + (local_38 - 1)].distance_from_desired = '\0';
      begin = this->entries;
      sVar4 = this->num_slots_minus_one;
      this->entries = psVar5;
      this->num_slots_minus_one = local_38 - 1;
      (this->hash_policy).shift = iVar2;
      max_lookups = this->max_lookups;
      this->max_lookups = iVar3;
      this->num_elements = 0;
      local_38 = sVar4;
      psVar1 = begin;
      for (lVar6 = (long)max_lookups * 0x40 + sVar4 * 0x40; key = &psVar1->field_1, lVar6 != 0;
          lVar6 = lVar6 + -0x40) {
        if (-1 < *(char *)((long)&key[-1].value + 0x30)) {
          sherwood_v3_table<std::pair<slang::ast::GenericClassDefSymbol::SpecializationKey,slang::ast::Type_const*>,slang::ast::GenericClassDefSymbol::SpecializationKey,slang::ast::GenericClassDefSymbol::Hasher,ska::detailv3::KeyOrValueHasher<slang::ast::GenericClassDefSymbol::SpecializationKey,std::pair<slang::ast::GenericClassDefSymbol::SpecializationKey,slang::ast::Type_const*>,slang::ast::GenericClassDefSymbol::Hasher>,std::equal_to<slang::ast::GenericClassDefSymbol::SpecializationKey>,ska::detailv3::KeyOrValueEquality<slang::ast::GenericClassDefSymbol::SpecializationKey,std::pair<slang::ast::GenericClassDefSymbol::SpecializationKey,slang::ast::Type_const*>,std::equal_to<slang::ast::GenericClassDefSymbol::SpecializationKey>>,std::allocator<std::pair<slang::ast::GenericClassDefSymbol::SpecializationKey,slang::ast::Type_const*>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ast::GenericClassDefSymbol::SpecializationKey,slang::ast::Type_const*>>>>
          ::
          emplace<std::pair<slang::ast::GenericClassDefSymbol::SpecializationKey,slang::ast::Type_const*>>
                    ((sherwood_v3_table<std::pair<slang::ast::GenericClassDefSymbol::SpecializationKey,slang::ast::Type_const*>,slang::ast::GenericClassDefSymbol::SpecializationKey,slang::ast::GenericClassDefSymbol::Hasher,ska::detailv3::KeyOrValueHasher<slang::ast::GenericClassDefSymbol::SpecializationKey,std::pair<slang::ast::GenericClassDefSymbol::SpecializationKey,slang::ast::Type_const*>,slang::ast::GenericClassDefSymbol::Hasher>,std::equal_to<slang::ast::GenericClassDefSymbol::SpecializationKey>,ska::detailv3::KeyOrValueEquality<slang::ast::GenericClassDefSymbol::SpecializationKey,std::pair<slang::ast::GenericClassDefSymbol::SpecializationKey,slang::ast::Type_const*>,std::equal_to<slang::ast::GenericClassDefSymbol::SpecializationKey>>,std::allocator<std::pair<slang::ast::GenericClassDefSymbol::SpecializationKey,slang::ast::Type_const*>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ast::GenericClassDefSymbol::SpecializationKey,slang::ast::Type_const*>>>>
                      *)this,&key->value);
          *(undefined1 *)((long)&key[-1].value + 0x30) = 0xff;
        }
        psVar1 = (EntryPointer)(key + 1);
      }
      deallocate_data(this,begin,local_38,max_lookups);
    }
    return;
  }
  reset_to_empty_state(this);
  return;
}

Assistant:

void rehash(size_t num_buckets)
    {
        num_buckets = std::max(num_buckets, static_cast<size_t>(std::ceil(num_elements / static_cast<double>(_max_load_factor))));
        if (num_buckets == 0)
        {
            reset_to_empty_state();
            return;
        }
        auto new_prime_index = hash_policy.next_size_over(num_buckets);
        if (num_buckets == bucket_count())
            return;
        int8_t new_max_lookups = compute_max_lookups(num_buckets);
        EntryPointer new_buckets(AllocatorTraits::allocate(*this, num_buckets + new_max_lookups));
        EntryPointer special_end_item = new_buckets + static_cast<ptrdiff_t>(num_buckets + new_max_lookups - 1);
        for (EntryPointer it = new_buckets; it != special_end_item; ++it)
            it->distance_from_desired = -1;
        special_end_item->distance_from_desired = Entry::special_end_value;
        std::swap(entries, new_buckets);
        std::swap(num_slots_minus_one, num_buckets);
        --num_slots_minus_one;
        hash_policy.commit(new_prime_index);
        int8_t old_max_lookups = max_lookups;
        max_lookups = new_max_lookups;
        num_elements = 0;
        for (EntryPointer it = new_buckets, end = it + static_cast<ptrdiff_t>(num_buckets + old_max_lookups); it != end; ++it)
        {
            if (it->has_value())
            {
                emplace(std::move(it->value));
                it->destroy_value();
            }
        }
        deallocate_data(new_buckets, num_buckets, old_max_lookups);
    }